

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverCrossSymbol::serializeTo(CoverCrossSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  reference ppCVar2;
  Expression *__n;
  ASTSerializer *in_RSI;
  CoverageOptionSetter *in_RDI;
  Symbol *in_stack_00000038;
  Expression *iff;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  CoverpointSymbol *target;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *__range2;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff40;
  ASTSerializer *in_stack_ffffffffffffff48;
  ASTSerializer *in_stack_ffffffffffffff50;
  int local_98;
  void *local_90;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  local_70;
  Expression **local_68;
  CoverpointSymbol *in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
  local_30;
  CoverageOptionSetter *local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
             (char *)in_stack_ffffffffffffff48);
  name._M_str = (char *)in_RDI;
  name._M_len = (size_t)in_RSI;
  ASTSerializer::startArray(in_stack_ffffffffffffff50,name);
  local_28 = in_RDI + 5;
  local_30._M_current =
       (CoverpointSymbol **)
       std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff38);
  std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = *ppCVar2;
    ASTSerializer::startObject((ASTSerializer *)0x5eb40f);
    in_stack_ffffffffffffff50 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
               (char *)in_stack_ffffffffffffff48);
    ASTSerializer::writeLink((ASTSerializer *)iff,_opt,in_stack_00000038);
    ASTSerializer::endObject((ASTSerializer *)0x5eb459);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x5eb478);
  bVar1 = std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
                     0x5eb489);
  if (!bVar1) {
    in_stack_ffffffffffffff48 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)local_10);
    name_00._M_str = (char *)in_RDI;
    name_00._M_len = (size_t)in_RSI;
    ASTSerializer::startArray(in_stack_ffffffffffffff50,name_00);
    local_68 = &in_RDI[5].expr;
    local_70._M_current =
         (CoverageOptionSetter *)
         std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffff38);
    std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::end
              ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
               in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        (in_stack_ffffffffffffff40,
                         (__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
      ::operator*(&local_70);
      ASTSerializer::startObject((ASTSerializer *)0x5eb524);
      CoverageOptionSetter::serializeTo(in_RDI,in_RSI);
      ASTSerializer::endObject((ASTSerializer *)0x5eb543);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
      ::operator++(&local_70);
    }
    ASTSerializer::endArray((ASTSerializer *)0x5eb55c);
  }
  __n = getIffExpr((CoverCrossSymbol *)in_stack_ffffffffffffffc0);
  if (__n != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    ASTSerializer::write(local_10,local_98,local_90,(size_t)__n);
  }
  return;
}

Assistant:

void CoverCrossSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("targets");
    for (auto target : targets) {
        serializer.startObject();
        serializer.writeLink("coverpoint", *target);
        serializer.endObject();
    }
    serializer.endArray();

    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options) {
            serializer.startObject();
            opt.serializeTo(serializer);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}